

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O3

void Mig_ManCreateChoices(Mig_Man_t *pMig,Gia_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  long lVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  
  uVar1 = pMig->nObjs;
  if (uVar1 != p->nObjs) {
    __assert_fail("Mig_ManObjNum(pMig) == Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                  ,0x32,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
  }
  if ((pMig->vSibls).nSize != 0) {
    __assert_fail("Vec_IntSize(&pMig->vSibls) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                  ,0x33,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
  }
  if ((pMig->vSibls).nCap < (int)uVar1) {
    piVar5 = (pMig->vSibls).pArray;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar5 = (int *)realloc(piVar5,(long)(int)uVar1 << 2);
    }
    (pMig->vSibls).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pMig->vSibls).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pMig->vSibls).pArray,0,(ulong)uVar1 * 4);
  }
  (pMig->vSibls).nSize = uVar1;
  Gia_ManMarkFanoutDrivers(p);
  if (p->nObjs < 1) {
LAB_008bf45e:
    Gia_ManCleanMark0(p);
    return;
  }
  uVar10 = 0;
LAB_008bf29e:
  if (p->pObjs != (Gia_Obj_t *)0x0) {
    pGVar7 = p->pObjs + uVar10;
    Gia_ObjSetPhase(p,pGVar7);
    if ((int)pGVar7->Value < 0) {
LAB_008bf471:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    if (uVar10 != pGVar7->Value >> 1) {
      __assert_fail("Abc_Lit2Var(pObj->Value) == i",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmAbc.c"
                    ,0x39,"void Mig_ManCreateChoices(Mig_Man_t *, Gia_Man_t *)");
    }
    if ((long)pMig->nObjs <= (long)uVar10) {
LAB_008bf4ed:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                    ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
    }
    uVar6 = uVar10 >> 0xc & 0xfffff;
    if ((pMig->vPages).nSize <= (int)uVar6) {
LAB_008bf4ce:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar2 = (pMig->vPages).pArray[uVar6];
    uVar6 = (ulong)(((uint)uVar10 & 0xfff) << 4);
    *(uint *)((long)pvVar2 + uVar6 + 0xc) =
         *(uint *)((long)pvVar2 + uVar6 + 0xc) & 0xfffffffe |
         (uint)((ulong)*(undefined8 *)pGVar7 >> 0x3f);
    piVar5 = p->pSibls;
    if (piVar5 != (int *)0x0) {
      uVar1 = piVar5[uVar10];
      if (((ulong)uVar1 != 0) && ((pGVar7->field_0x3 & 0x40) != 0)) {
        if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) {
LAB_008bf50c:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        uVar9 = pGVar7->Value;
        if (-1 < (int)uVar9) {
          pGVar7 = p->pObjs + uVar1;
          do {
            if (pMig->nObjs <= (int)(uVar9 >> 1)) goto LAB_008bf4ed;
            if ((pMig->vPages).nSize <= (int)(uVar9 >> 0xd)) goto LAB_008bf4ce;
            uVar1 = pGVar7->Value;
            if ((int)uVar1 < 0) break;
            if (uVar1 < 2) {
LAB_008bf490:
              __assert_fail("s > 0 && Mig_ObjId(p) > s",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                            ,0xbd,"void Mig_ObjSetSiblId(Mig_Obj_t *, int)");
            }
            uVar8 = (uVar9 >> 1 & 0xfff) << 4;
            pvVar2 = (pMig->vPages).pArray[uVar9 >> 0xd];
            uVar9 = *(uint *)((long)pvVar2 + (ulong)uVar8 + 0xc) >> 1;
            if (uVar9 <= uVar1 >> 1) goto LAB_008bf490;
            lVar3 = *(long *)((long)pvVar2 + ((ulong)uVar8 - (ulong)((uVar9 & 0xfff) << 4)) + -0x10)
            ;
            if (*(int *)(lVar3 + 0x7c) <= (int)uVar9) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(uint *)(*(long *)(lVar3 + 0x80) + (ulong)uVar9 * 4) = uVar1 >> 1;
            pGVar4 = p->pObjs;
            if ((pGVar7 < pGVar4) || (pGVar4 + p->nObjs <= pGVar7)) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            uVar1 = piVar5[(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555];
            if ((ulong)uVar1 == 0) goto LAB_008bf44a;
            if (((int)uVar1 < 0) || (p->nObjs <= (int)uVar1)) goto LAB_008bf50c;
            uVar9 = pGVar7->Value;
            pGVar7 = pGVar4 + uVar1;
            if ((int)uVar9 < 0) break;
          } while( true );
        }
        goto LAB_008bf471;
      }
    }
    goto LAB_008bf44e;
  }
  goto LAB_008bf45e;
LAB_008bf44a:
  pMig->nChoices = pMig->nChoices + 1;
LAB_008bf44e:
  uVar10 = uVar10 + 1;
  if ((long)p->nObjs <= (long)uVar10) goto LAB_008bf45e;
  goto LAB_008bf29e;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Mig_ManCreateChoices( Mig_Man_t * pMig, Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( Mig_ManObjNum(pMig) == Gia_ManObjNum(p) );
    assert( Vec_IntSize(&pMig->vSibls) == 0 );
    Vec_IntFill( &pMig->vSibls, Gia_ManObjNum(p), 0 );
    Gia_ManMarkFanoutDrivers( p );
    Gia_ManForEachObj( p, pObj, i )
    {
        Gia_ObjSetPhase( p, pObj );
        assert( Abc_Lit2Var(pObj->Value) == i );
        Mig_ObjSetPhase( Mig_ManObj(pMig, i), pObj->fPhase );
        if ( Gia_ObjSibl(p, i) && pObj->fMark0 )
        {
            Gia_Obj_t * pSibl, * pPrev;
            for ( pPrev = pObj, pSibl = Gia_ObjSiblObj(p, i); pSibl; pPrev = pSibl, pSibl = Gia_ObjSiblObj(p, Gia_ObjId(p, pSibl)) )
                Mig_ObjSetSiblId( Mig_ManObj(pMig, Abc_Lit2Var(pPrev->Value)), Abc_Lit2Var(pSibl->Value) );
            pMig->nChoices++;
        }
    }
    Gia_ManCleanMark0( p );
}